

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O1

void __thiscall FTraceInfo::SetSourcePosition(FTraceInfo *this)

{
  double x;
  FTraceResults *pFVar1;
  double dVar2;
  
  pFVar1 = this->Results;
  (pFVar1->SrcFromTarget).Z = (this->Start).Z;
  (pFVar1->SrcFromTarget).Y = (this->Start).Y;
  (pFVar1->SrcFromTarget).X = (this->Start).X;
  (pFVar1->HitVector).Z = (this->Vec).Z;
  dVar2 = (this->Vec).Y;
  (pFVar1->HitVector).Y = dVar2;
  x = (this->Vec).X;
  (pFVar1->HitVector).X = x;
  dVar2 = c_atan2(dVar2,x);
  (this->Results->SrcAngleFromTarget).Degrees = dVar2 * 57.29577951308232;
  return;
}

Assistant:

void SetSourcePosition()
	{
		Results->SrcFromTarget = Start;
		Results->HitVector = Vec;
		Results->SrcAngleFromTarget = Results->HitVector.Angle();
	}